

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

bool ProcessCommand(char *buffer,Player *player,bool *client_connected)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  bool bVar5;
  string arg;
  string command;
  char s_arg [512];
  char s_command [512];
  char *local_4d8;
  char *local_4d0;
  char local_4c8 [16];
  undefined1 *local_4b8;
  char *local_4b0;
  undefined1 local_4a8 [16];
  string local_498;
  string local_478;
  string local_458;
  char local_438 [512];
  char local_238 [520];
  
  local_4b8 = local_4a8;
  local_4b0 = (char *)0x0;
  local_4a8[0] = 0;
  local_4d8 = local_4c8;
  local_4d0 = (char *)0x0;
  local_4c8[0] = '\0';
  iVar2 = __isoc99_sscanf(buffer,"%s %s",local_238,local_438);
  pcVar1 = local_4b0;
  strlen(local_238);
  std::__cxx11::string::_M_replace((ulong)&local_4b8,0,pcVar1,(ulong)local_238);
  pcVar1 = local_4d0;
  strlen(local_438);
  std::__cxx11::string::_M_replace((ulong)&local_4d8,0,pcVar1,(ulong)local_438);
  iVar3 = std::__cxx11::string::compare((char *)&local_4b8);
  if ((iVar2 == 2) && (iVar3 == 0)) {
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_458,local_4d8,local_4d0 + (long)local_4d8);
    CreateJoinGame(player,&local_458);
    bVar5 = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_4b8);
    if ((iVar2 == 2) && (iVar3 == 0)) {
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_478,local_4d8,local_4d0 + (long)local_4d8);
      Player::SetName(player,&local_478);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p);
      }
      iVar2 = Player::GetSocket(player);
      SendStatus(iVar2,REGISTERED);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Registered player name \"",0x18);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4d8,(long)local_4d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      bVar5 = true;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_4b8);
      if ((iVar2 == 1) && (iVar3 == 0)) {
        ListGames(player);
        Player::GetName_abi_cxx11_(&local_498,player);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_498._M_dataplus._M_p,
                            local_498._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," listed all open games",0x16);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_4b8);
        bVar5 = false;
        if ((iVar2 != 1) || (bVar5 = false, iVar3 != 0)) goto LAB_0010459e;
        iVar2 = Player::GetSocket(player);
        SendStatus(iVar2,PLAYER_DISCONNECT);
        *client_connected = false;
      }
      bVar5 = true;
    }
  }
LAB_0010459e:
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8);
  }
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8);
  }
  return bVar5;
}

Assistant:

bool ProcessCommand(char buffer[], Player & player, bool & client_connected)
{
    char s_command[BUF_SIZE], s_arg[BUF_SIZE];
    string command, arg;
    bool valid_cmd = true;

    // Convert the input command into separate command and argument
    int num = sscanf(buffer, "%s %s", s_command, s_arg);
    command = s_command;
    arg = s_arg;

    // Scanf needs to have captured either one or two strings
    if(command == "join" && num == 2)
    {
        CreateJoinGame(player, arg);
    }
    else if (command == "register" && num == 2)
    {
        // Set the player's name
        player.SetName(arg);
        SendStatus(player.GetSocket(), REGISTERED);
        cout << "Registered player name \"" << arg << "\"" << endl;
    }
    else if (command == "list" && num == 1)
    {
        ListGames(player);
        cout << player.GetName() << " listed all open games" << endl;
    }
    else if (command == "leave" && num == 1)
    {
        SendStatus(player.GetSocket(), PLAYER_DISCONNECT);
        client_connected = false;
    }
    else
        valid_cmd = false;

    return valid_cmd;
}